

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abeta.hpp
# Opt level: O0

vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_> * __thiscall
minimax::ABeta<uttt::IBoard,_uttt::Eval1>::operator()
          (ABeta<uttt::IBoard,_uttt::Eval1> *this,IBoard *game,int depth)

{
  bool bVar1;
  iterator this_00;
  iterator iVar2;
  iterator iVar3;
  int in_ECX;
  undefined8 *in_RDX;
  vector<long,_std::allocator<long>_> *in_RDI;
  vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_> r;
  future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_> *f;
  iterator __end2;
  iterator __begin2;
  vector<std::future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>,_std::allocator<std::future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>_>_>
  *__range2;
  int i;
  mutex mutex;
  int num_threads;
  vector<std::future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>,_std::allocator<std::future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>_>_>
  futures;
  vector<long,_std::allocator<long>_> moves;
  vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_> *results;
  vector<std::future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>,_std::allocator<std::future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>_>_>
  *in_stack_fffffffffffffe88;
  __normal_iterator<const_std::pair<long,_double>_*,_std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>
  *in_stack_fffffffffffffe90;
  future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>
  *in_stack_fffffffffffffe98;
  vector<long,_std::allocator<long>_> *this_01;
  future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>
  *in_stack_fffffffffffffeb8;
  const_iterator in_stack_fffffffffffffee8;
  __normal_iterator<const_std::pair<long,_double>_*,_std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>
  local_110;
  IBoard *in_stack_fffffffffffffef8;
  type_conflict *in_stack_ffffffffffffff00;
  undefined8 in_stack_ffffffffffffff08;
  __normal_iterator<std::future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>_*,_std::vector<std::future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>,_std::allocator<std::future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>_>_>_>
  local_e8;
  undefined1 *local_e0;
  undefined1 local_d5;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  int local_b0;
  undefined1 *local_a8;
  undefined1 *local_a0;
  int local_84;
  undefined1 local_80 [44];
  int local_54;
  undefined1 local_50 [24];
  undefined1 local_38 [28];
  int local_1c;
  undefined8 *local_18;
  
  if (in_ECX < 1) {
    memset(in_RDI,0,0x18);
    std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>::vector
              ((vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_> *)
               0x23ab08);
  }
  else {
    this_01 = in_RDI;
    local_1c = in_ECX;
    local_18 = in_RDX;
    uttt::IBoard::GetPossibleMoves(in_stack_fffffffffffffef8);
    std::
    vector<std::future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>,_std::allocator<std::future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>_>_>
    ::vector((vector<std::future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>,_std::allocator<std::future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>_>_>
              *)0x23ab2f);
    local_54 = std::thread::hardware_concurrency();
    std::mutex::mutex((mutex *)0x23ab48);
    for (local_84 = 0; local_84 < local_54; local_84 = local_84 + 1) {
      local_b8 = local_18[2];
      local_c8 = *local_18;
      uStack_c0 = local_18[1];
      local_b0 = local_1c;
      local_a8 = local_38;
      local_a0 = local_80;
      std::operator()((launch)((ulong)in_stack_ffffffffffffff08 >> 0x20),in_stack_ffffffffffffff00);
      std::
      vector<std::future<std::vector<std::pair<long,double>,std::allocator<std::pair<long,double>>>>,std::allocator<std::future<std::vector<std::pair<long,double>,std::allocator<std::pair<long,double>>>>>>
      ::
      emplace_back<std::future<std::vector<std::pair<long,double>,std::allocator<std::pair<long,double>>>>>
                ((vector<std::future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>,_std::allocator<std::future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>_>_>
                  *)this_01,in_stack_fffffffffffffe98);
      std::future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>
      ::~future((future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>
                 *)0x23abf4);
    }
    local_d5 = 0;
    std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>::vector
              ((vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_> *)
               0x23ac5b);
    local_e0 = local_50;
    local_e8._M_current =
         (future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_> *
         )std::
          vector<std::future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>,_std::allocator<std::future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>_>_>
          ::begin(in_stack_fffffffffffffe88);
    std::
    vector<std::future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>,_std::allocator<std::future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>_>_>
    ::end(in_stack_fffffffffffffe88);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>_*,_std::vector<std::future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>,_std::allocator<std::future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>_>_>_>
                               *)in_stack_fffffffffffffe90,
                              (__normal_iterator<std::future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>_*,_std::vector<std::future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>,_std::allocator<std::future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>_>_>_>
                               *)in_stack_fffffffffffffe88), bVar1) {
      __gnu_cxx::
      __normal_iterator<std::future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>_*,_std::vector<std::future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>,_std::allocator<std::future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>_>_>_>
      ::operator*(&local_e8);
      std::future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>
      ::get(in_stack_fffffffffffffeb8);
      iVar2 = std::end<std::vector<std::pair<long,double>,std::allocator<std::pair<long,double>>>>
                        ((vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>
                          *)in_stack_fffffffffffffe88);
      __gnu_cxx::
      __normal_iterator<std::pair<long,double>const*,std::vector<std::pair<long,double>,std::allocator<std::pair<long,double>>>>
      ::__normal_iterator<std::pair<long,double>*>
                (in_stack_fffffffffffffe90,
                 (__normal_iterator<std::pair<long,_double>_*,_std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>
                  *)in_stack_fffffffffffffe88);
      in_stack_fffffffffffffe90 = &local_110;
      iVar3 = std::begin<std::vector<std::pair<long,double>,std::allocator<std::pair<long,double>>>>
                        ((vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>
                          *)in_stack_fffffffffffffe88);
      this_00 = std::end<std::vector<std::pair<long,double>,std::allocator<std::pair<long,double>>>>
                          ((vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>
                            *)in_stack_fffffffffffffe88);
      std::vector<std::pair<long,double>,std::allocator<std::pair<long,double>>>::
      insert<__gnu_cxx::__normal_iterator<std::pair<long,double>*,std::vector<std::pair<long,double>,std::allocator<std::pair<long,double>>>>,void>
                ((vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_> *)
                 this_00._M_current,in_stack_fffffffffffffee8,
                 (__normal_iterator<std::pair<long,_double>_*,_std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>
                  )iVar2._M_current,
                 (__normal_iterator<std::pair<long,_double>_*,_std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>
                  )iVar3._M_current);
      std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>::~vector
                ((vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_> *)
                 this_01);
      __gnu_cxx::
      __normal_iterator<std::future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>_*,_std::vector<std::future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>,_std::allocator<std::future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>_>_>_>
      ::operator++(&local_e8);
    }
    iVar2 = std::begin<std::vector<std::pair<long,double>,std::allocator<std::pair<long,double>>>>
                      ((vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_> *
                       )in_stack_fffffffffffffe88);
    iVar3 = std::end<std::vector<std::pair<long,double>,std::allocator<std::pair<long,double>>>>
                      ((vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_> *
                       )in_stack_fffffffffffffe88);
    std::operator()(iVar2._M_current,iVar3._M_current);
    local_d5 = 1;
    std::
    vector<std::future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>,_std::allocator<std::future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>_>_>
    ::~vector((vector<std::future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>,_std::allocator<std::future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>_>_>
               *)this_01);
    std::vector<long,_std::allocator<long>_>::~vector(this_01);
  }
  return (vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_> *)in_RDI;
}

Assistant:

std::vector<std::pair<game::IMove, double>>
ABeta<IGame, Eval>::operator()(const IGame &game, int depth) const
{
    if (depth <= 0)
        return {};

    auto moves = game.GetPossibleMoves();
    std::vector<std::future<std::vector<std::pair<game::IMove, double>>>> futures;
    int num_threads = std::thread::hardware_concurrency();
    std::mutex mutex;

    for (int i = 0; i < num_threads; ++i)
        futures.emplace_back(std::async(std::launch::async, [game, depth, &moves, &mutex] {
            std::vector<std::pair<game::IMove, double>> results;
            while (true)
            {
                mutex.lock();
                if (moves.empty())
                {
                    mutex.unlock();
                    break;
                }
                game::IMove move = moves.back();
                moves.pop_back();
                mutex.unlock();
                IGame new_game(game);
                new_game.ApplyMove(move);
                results.emplace_back(move, -ABeta_<IGame, Eval>(new_game, depth - 1, -std::numeric_limits<double>::max(), std::numeric_limits<double>::max()));
            }
            return results;
        }));

    std::vector<std::pair<game::IMove, double>> results;
    for (auto &f : futures)
    {
        auto r = f.get();
        results.insert(std::end(results), std::begin(r), std::end(r));
    }

    std::sort(std::begin(results), std::end(results), [](const std::pair<game::IMove, double> &e1, const std::pair<game::IMove, double> &e2) {
        return e1.second > e2.second;
    });
    return results;
}